

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O3

void __thiscall
tchecker::while_statement_t::while_statement_t
          (while_statement_t *this,shared_ptr<const_tchecker::expression_t> *cond,
          shared_ptr<const_tchecker::statement_t> *stmt)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  invalid_argument *this_00;
  
  *(undefined ***)this = &PTR__while_statement_t_00218ef0;
  (this->_condition).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (cond->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (cond->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_condition).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_stmt).super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (stmt->super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (stmt->super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_stmt).super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((cond->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr condition");
  }
  else {
    if ((stmt->super___shared_ptr<const_tchecker::statement_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        != (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr iterated statement");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

while_statement_t::while_statement_t(std::shared_ptr<tchecker::expression_t const> const & cond,
                                     std::shared_ptr<tchecker::statement_t const> const & stmt)
    : _condition(cond), _stmt(stmt)
{
  if (cond.get() == nullptr)
    throw std::invalid_argument("nullptr condition");
  if (stmt.get() == nullptr)
    throw std::invalid_argument("nullptr iterated statement");
}